

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FZFile.cpp
# Opt level: O0

string * FZFile::fz_key_to_string<44ul>(array<unsigned_int,_44UL> *fzkey)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  const_reference pvVar4;
  string *in_RDI;
  size_t j;
  size_t i;
  stringstream sstr;
  size_type in_stack_fffffffffffffdf8;
  ulong local_1a8;
  ulong local_1a0;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  for (local_1a0 = 0; local_1a0 < 0x2c; local_1a0 = local_1a0 + 4) {
    for (local_1a8 = 0; local_1a8 < 4; local_1a8 = local_1a8 + 1) {
      poVar3 = std::operator<<(local_188," 0x");
      _Var1 = std::setfill<char>('0');
      poVar3 = std::operator<<(poVar3,_Var1._M_c);
      _Var2 = std::setw(8);
      poVar3 = std::operator<<(poVar3,_Var2);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
      pvVar4 = std::array<unsigned_int,_44UL>::operator[]
                         ((array<unsigned_int,_44UL> *)poVar3,in_stack_fffffffffffffdf8);
      std::ostream::operator<<(poVar3,*pvVar4);
    }
    std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string FZFile::fz_key_to_string(const std::array<uint32_t, N> &fzkey) {
	std::stringstream sstr;
	for (size_t i = 0; i < N; i += 4) {
		for (size_t j = 0; j < 4; j++) {
			sstr << " 0x" << std::setfill ('0') << std::setw(8) << std::hex << fzkey[i + j];
		}
		sstr << std::endl;
	}
	return sstr.str();
}